

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_base_clock(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  envy_bios_power_base_clock_entry *peVar7;
  ulong uVar8;
  uint16_t *puVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint16_t uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  
  uVar12 = (bios->power).base_clock.offset;
  if ((ulong)uVar12 == 0) {
    return -0x16;
  }
  if (uVar12 < bios->length) {
    uVar1 = bios->data[uVar12];
    (bios->power).base_clock.version = uVar1;
  }
  else {
    (bios->power).base_clock.version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    uVar1 = (bios->power).base_clock.version;
  }
  if (uVar1 == ' ') {
    uVar11 = (bios->power).base_clock.offset;
    uVar12 = uVar11 + 1;
    uVar10 = bios->length;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.hlen = bios->data[uVar12];
      iVar17 = 0;
    }
    else {
      (bios->power).base_clock.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
      iVar17 = -0xe;
    }
    uVar12 = uVar11 + 2;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.rlen = bios->data[uVar12];
      iVar15 = 0;
    }
    else {
      (bios->power).base_clock.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
      iVar15 = -0xe;
    }
    uVar12 = uVar11 + 3;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.entriesnum = bios->data[uVar12];
      iVar3 = 0;
    }
    else {
      (bios->power).base_clock.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
      iVar3 = -0xe;
    }
    uVar12 = uVar11 + 4;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.secount = bios->data[uVar12];
      iVar4 = 0;
    }
    else {
      (bios->power).base_clock.secount = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
      iVar4 = -0xe;
    }
    if (uVar11 + 5 < uVar10) {
      (bios->power).base_clock.selen = bios->data[uVar11 + 5];
      iVar5 = 0;
    }
    else {
      (bios->power).base_clock.selen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    (bios->power).base_clock.valid =
         (((iVar15 == 0 && iVar17 == 0) && iVar3 == 0) && iVar4 == 0) && iVar5 == 0;
    if ((((iVar15 != 0 || iVar17 != 0) || iVar3 != 0) || iVar4 != 0) || iVar5 != 0) {
      return -0x16;
    }
    uVar11 = (bios->power).base_clock.offset;
    uVar12 = uVar11 + 6;
    uVar10 = bios->length;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.boost_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 7;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.turbo_boost_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.turbo_boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 8;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.rated_tdp_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.rated_tdp_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 0xc;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.vrhot_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.vrhot_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 0xd;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.max_batt_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.max_batt_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 0xe;
    if (uVar12 < uVar10) {
      (bios->power).base_clock.unk15_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.unk15_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
      uVar11 = (bios->power).base_clock.offset;
      uVar10 = bios->length;
    }
    uVar12 = uVar11 + 0xf;
    if (uVar10 <= uVar12) {
      (bios->power).base_clock.unk16_entry = '\0';
LAB_00260eaa:
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      goto LAB_00260713;
    }
    puVar6 = bios->data;
LAB_002606de:
    (bios->power).base_clock.unk16_entry = puVar6[uVar12];
    goto LAB_00260713;
  }
  if (uVar1 != '\x10') {
    envy_bios_parse_power_base_clock_cold_1();
    return -0x16;
  }
  uVar11 = (bios->power).base_clock.offset;
  uVar12 = uVar11 + 1;
  uVar10 = bios->length;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.hlen = bios->data[uVar12];
    iVar17 = 0;
  }
  else {
    (bios->power).base_clock.hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
    iVar17 = -0xe;
  }
  uVar12 = uVar11 + 2;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.rlen = bios->data[uVar12];
    iVar15 = 0;
  }
  else {
    (bios->power).base_clock.rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
    iVar15 = -0xe;
  }
  uVar12 = uVar11 + 3;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.selen = bios->data[uVar12];
    iVar3 = 0;
  }
  else {
    (bios->power).base_clock.selen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
    iVar3 = -0xe;
  }
  uVar12 = uVar11 + 4;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.secount = bios->data[uVar12];
    iVar4 = 0;
  }
  else {
    (bios->power).base_clock.secount = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
    iVar4 = -0xe;
  }
  if (uVar11 + 5 < uVar10) {
    (bios->power).base_clock.entriesnum = bios->data[uVar11 + 5];
    iVar5 = 0;
  }
  else {
    (bios->power).base_clock.entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar5 = -0xe;
  }
  (bios->power).base_clock.valid =
       (((iVar15 == 0 && iVar17 == 0) && iVar3 == 0) && iVar4 == 0) && iVar5 == 0;
  if ((((iVar15 != 0 || iVar17 != 0) || iVar3 != 0) || iVar4 != 0) || iVar5 != 0) {
    return -0x16;
  }
  uVar11 = (bios->power).base_clock.offset;
  uVar12 = uVar11 + 6;
  uVar10 = bios->length;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.d2_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.d2_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 7;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.d3_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.d3_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 8;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.d4_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.d4_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 9;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.d5_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.d5_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 10;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.over_current_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.over_current_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 0xb;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.vrhot_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.vrhot_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 0xc;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.max_batt_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.max_batt_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 0xd;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.max_sli_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.max_sli_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  uVar12 = uVar11 + 0xe;
  if (uVar12 < uVar10) {
    (bios->power).base_clock.max_therm_sustain_entry = bios->data[uVar12];
  }
  else {
    (bios->power).base_clock.max_therm_sustain_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
    uVar11 = (bios->power).base_clock.offset;
    uVar10 = bios->length;
  }
  if (uVar11 + 0xf < uVar10) {
    (bios->power).base_clock.boost_entry = bios->data[uVar11 + 0xf];
  }
  else {
    (bios->power).base_clock.boost_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
  bVar2 = (bios->power).base_clock.hlen;
  if (bVar2 < 0x11) {
    (bios->power).base_clock.turbo_boost_entry = 0xff;
LAB_002606f0:
    (bios->power).base_clock.rated_tdp_entry = 0xff;
LAB_002606f7:
    (bios->power).base_clock.slowdown_pwr_entry = 0xff;
LAB_002606fe:
    (bios->power).base_clock.mid_point_entry = 0xff;
LAB_00260705:
    (bios->power).base_clock.unk15_entry = 0xff;
  }
  else {
    uVar12 = (bios->power).base_clock.offset + 0x10;
    if (uVar12 < bios->length) {
      (bios->power).base_clock.turbo_boost_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.turbo_boost_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->power).base_clock.hlen;
    }
    if (bVar2 < 0x12) goto LAB_002606f0;
    uVar12 = (bios->power).base_clock.offset + 0x11;
    if (uVar12 < bios->length) {
      (bios->power).base_clock.rated_tdp_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.rated_tdp_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->power).base_clock.hlen;
    }
    if (bVar2 < 0x13) goto LAB_002606f7;
    uVar12 = (bios->power).base_clock.offset + 0x12;
    if (uVar12 < bios->length) {
      (bios->power).base_clock.slowdown_pwr_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.slowdown_pwr_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->power).base_clock.hlen;
    }
    if (bVar2 < 0x14) goto LAB_002606fe;
    uVar12 = (bios->power).base_clock.offset + 0x13;
    if (uVar12 < bios->length) {
      (bios->power).base_clock.mid_point_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.mid_point_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->power).base_clock.hlen;
    }
    if (bVar2 < 0x16) goto LAB_00260705;
    uVar12 = (bios->power).base_clock.offset + 0x15;
    if (uVar12 < bios->length) {
      (bios->power).base_clock.unk15_entry = bios->data[uVar12];
    }
    else {
      (bios->power).base_clock.unk15_entry = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->power).base_clock.hlen;
    }
    if (0x16 < bVar2) {
      uVar12 = (bios->power).base_clock.offset + 0x16;
      if (bios->length <= uVar12) {
        (bios->power).base_clock.unk16_entry = '\0';
        goto LAB_00260eaa;
      }
      puVar6 = bios->data;
      goto LAB_002606de;
    }
  }
  (bios->power).base_clock.unk16_entry = 0xff;
LAB_00260713:
  bVar2 = (bios->power).base_clock.entriesnum;
  peVar7 = (envy_bios_power_base_clock_entry *)malloc((ulong)((uint)bVar2 * 8) * 3);
  (bios->power).base_clock.entries = peVar7;
  if (bVar2 != 0) {
    uVar8 = (ulong)(bios->power).base_clock.secount;
    uVar14 = 0;
    do {
      peVar7 = (bios->power).base_clock.entries + uVar14;
      uVar12 = (int)uVar14 *
               ((int)uVar8 * (uint)(bios->power).base_clock.selen +
               (uint)(bios->power).base_clock.rlen) +
               (uint)(bios->power).base_clock.hlen + (bios->power).base_clock.offset;
      peVar7->offset = uVar12;
      if (uVar12 < bios->length) {
        peVar7->pstate = bios->data[uVar12];
      }
      else {
        peVar7->pstate = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      }
      if ((bios->power).base_clock.version == '\x10') {
        uVar11 = peVar7->offset;
        uVar12 = bios->length;
        if (uVar11 + 2 < uVar12) {
          peVar7->reqPower = CONCAT11(bios->data[uVar11 + 2],bios->data[uVar11 + 1]);
        }
        else {
          peVar7->reqPower = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar11 = peVar7->offset;
          uVar12 = bios->length;
        }
        if (uVar11 + 4 < uVar12) {
          peVar7->reqSlowdownPower = CONCAT11(bios->data[uVar11 + 4],bios->data[uVar11 + 3]);
        }
        else {
          peVar7->reqSlowdownPower = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        }
      }
      bVar2 = (bios->power).base_clock.secount;
      puVar9 = (uint16_t *)malloc((ulong)((uint)bVar2 + (uint)bVar2));
      peVar7->clock = puVar9;
      if (bVar2 == 0) {
        uVar8 = 0;
      }
      else {
        uVar16 = 0;
        do {
          uVar12 = (uint)(bios->power).base_clock.selen * (int)uVar16 +
                   (uint)(bios->power).base_clock.rlen + peVar7->offset;
          uVar1 = (bios->power).base_clock.version;
          if (uVar1 == ' ') {
            if (uVar12 + 3 < bios->length) {
              uVar13 = (ushort)bios->data[uVar12 + 3] * 0x400 + (ushort)bios->data[uVar12 + 2] * 4;
            }
            else {
              uVar13 = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)(uVar12 + 2));
            }
            peVar7->clock[uVar16] = uVar13;
          }
          else if (uVar1 == '\x10') {
            if (uVar12 + 1 < bios->length) {
              peVar7->clock[uVar16] = CONCAT11(bios->data[uVar12 + 1],bios->data[uVar12]);
            }
            else {
              peVar7->clock[uVar16] = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
          }
          uVar16 = uVar16 + 1;
          uVar8 = (ulong)(bios->power).base_clock.secount;
        } while (uVar16 < uVar8);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (bios->power).base_clock.entriesnum);
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_base_clock(struct envy_bios *bios) {
	struct envy_bios_power_base_clock *bc = &bios->power.base_clock;
	int i, j, err = 0;

	if (!bc->offset)
		return -EINVAL;

	bios_u8(bios, bc->offset + 0x0, &bc->version);
	switch(bc->version) {
	case 0x10:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->selen);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->entriesnum);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->d2_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->d3_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->d4_entry);
			bios_u8(bios, bc->offset + 0x09, &bc->d5_entry);
			bios_u8(bios, bc->offset + 0x0a, &bc->over_current_entry);
			bios_u8(bios, bc->offset + 0x0b, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_sli_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->max_therm_sustain_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->boost_entry);
			if (bc->hlen > 0x10)
				bios_u8(bios, bc->offset + 0x10, &bc->turbo_boost_entry);
			else
				bc->turbo_boost_entry = 0xff;
			if (bc->hlen > 0x11)
				bios_u8(bios, bc->offset + 0x11, &bc->rated_tdp_entry);
			else
				bc->rated_tdp_entry = 0xff;
			if (bc->hlen > 0x12)
				bios_u8(bios, bc->offset + 0x12, &bc->slowdown_pwr_entry);
			else
				bc->slowdown_pwr_entry = 0xff;
			if (bc->hlen > 0x13)
				bios_u8(bios, bc->offset + 0x13, &bc->mid_point_entry);
			else
				bc->mid_point_entry = 0xff;
			if (bc->hlen > 0x15)
				bios_u8(bios, bc->offset + 0x15, &bc->unk15_entry);
			else
				bc->unk15_entry = 0xff;
			if (bc->hlen > 0x16)
				bios_u8(bios, bc->offset + 0x16, &bc->unk16_entry);
			else
				bc->unk16_entry = 0xff;
		} else {
			return -EINVAL;
		}

		break;
	case 0x20:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->entriesnum);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->selen);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->boost_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->turbo_boost_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->rated_tdp_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->unk15_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->unk16_entry);
		} else {
			return -EINVAL;
		}

		break;
	default:
		ENVY_BIOS_ERR("BASE CLOCKS table version 0x%x\n", bc->version);
		return -EINVAL;
	};

	err = 0;
	bc->entries = malloc(bc->entriesnum * sizeof(struct envy_bios_power_base_clock_entry));
	for (i = 0; i < bc->entriesnum; i++) {
		struct envy_bios_power_base_clock_entry *bce = &bc->entries[i];

		bce->offset = bc->offset + bc->hlen + i * (bc->rlen + (bc->selen * bc->secount));
		bios_u8(bios, bce->offset, &bce->pstate);

		if (bc->version == 0x10) {
			bios_u16(bios, bce->offset + 0x1, &bce->reqPower);
			bios_u16(bios, bce->offset + 0x3, &bce->reqSlowdownPower);
		}

		bce->clock = malloc(bc->secount * sizeof(uint16_t));
		for (j = 0; j < bc->secount; j++) {
			uint32_t suboffset = bce->offset + bc->rlen + j * bc->selen;
			uint16_t clock;
			switch (bc->version) {
			case 0x10:
				bios_u16(bios, suboffset, &bce->clock[j]);
				break;
			case 0x20:
				bios_u16(bios, suboffset + 0x2, &clock);
				bce->clock[j] = clock * 4;
				break;
			}
		}
	}

	return 0;
}